

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O2

StatusOr<bool> __thiscall
google::protobuf::json_internal::UnparseProto3Type::GetBool
          (UnparseProto3Type *this,Field f,Msg *msg,size_t idx)

{
  reference pBVar1;
  undefined8 extraout_RDX;
  StatusOr<bool> SVar2;
  Span<const_google::protobuf::json_internal::UntypedMessage::Bool> local_20;
  
  local_20 = UntypedMessage::Get<google::protobuf::json_internal::UntypedMessage::Bool>
                       (msg,(f->raw_->field_0)._impl_.number_);
  pBVar1 = absl::lts_20240722::Span<const_google::protobuf::json_internal::UntypedMessage::Bool>::
           operator[](&local_20,idx);
  this[8] = (UnparseProto3Type)(*pBVar1 == kTrue);
  *(undefined8 *)this = 1;
  SVar2.super_StatusOrData<bool>._8_8_ = extraout_RDX;
  SVar2.super_StatusOrData<bool>.field_0 = (anon_union_8_1_1246618d_for_StatusOrData<bool>_1)this;
  return (StatusOr<bool>)SVar2.super_StatusOrData<bool>;
}

Assistant:

static absl::StatusOr<bool> GetBool(Field f, const Msg& msg, size_t idx = 0) {
    return msg.Get<Msg::Bool>(f->proto().number())[idx] == Msg::kTrue;
  }